

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

int32_t decShiftToMost(uint8_t *uar,int32_t digits,int32_t shift)

{
  int iVar1;
  byte bVar2;
  uint32_t uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar9 = digits;
  if (shift != 0) {
    uVar9 = shift + digits;
    if ((int)uVar9 < 2) {
      *uar = *uar * (char)DECPOWERS[shift];
    }
    else {
      if (digits < 0x32) {
        digits = (int32_t)""[digits];
      }
      if (shift < 0x32) {
        uVar4 = (ulong)""[shift];
        uVar10 = (uint)""[shift];
      }
      else {
        uVar4 = (ulong)(uint)shift;
        uVar10 = shift;
      }
      pbVar7 = uar + ((ulong)(uint)digits - 1);
      iVar1 = (shift - uVar10) + 1;
      if (iVar1 == 1) {
        for (; uar <= pbVar7; pbVar7 = pbVar7 + -1) {
          pbVar7[uVar4] = *pbVar7;
        }
        pbVar8 = pbVar7 + uVar4;
        iVar6 = 0;
      }
      else {
        iVar5 = -(shift - uVar10);
        uVar10 = uVar9;
        if (uVar9 < 0x32) {
          uVar10 = (uint)""[uVar9];
        }
        iVar6 = 0;
        for (; pbVar8 = pbVar7 + uVar4, uar <= pbVar7; pbVar7 = pbVar7 + -1) {
          bVar2 = *pbVar7;
          uVar11 = (uint)(bVar2 >> ((byte)iVar5 & 0x1f)) * multies[iVar5] >> 0x11;
          uVar3 = DECPOWERS[iVar5];
          if (pbVar8 <= uar + ((ulong)uVar10 - 1)) {
            *pbVar8 = (char)uVar11 + (char)iVar6;
          }
          iVar6 = ((uint)bVar2 - uVar3 * uVar11) * DECPOWERS[iVar1];
        }
      }
      for (; uar <= pbVar8; pbVar8 = pbVar8 + -1) {
        *pbVar8 = (byte)iVar6;
        iVar6 = 0;
      }
    }
  }
  return uVar9;
}

Assistant:

static Int decShiftToMost(Unit *uar, Int digits, Int shift) {
  Unit  *target, *source, *first;  /* work  */
  Int   cut;                       /* odd 0's to add  */
  uInt  next;                      /* work  */

  if (shift==0) return digits;     /* [fastpath] nothing to do  */
  if ((digits+shift)<=DECDPUN) {   /* [fastpath] single-unit case  */
    *uar=(Unit)(*uar*powers[shift]);
    return digits+shift;
    }

  next=0;                          /* all paths  */
  source=uar+D2U(digits)-1;        /* where msu comes from  */
  target=source+D2U(shift);        /* where upper part of first cut goes  */
  cut=DECDPUN-MSUDIGITS(shift);    /* where to slice  */
  if (cut==0) {                    /* unit-boundary case  */
    for (; source>=uar; source--, target--) *target=*source;
    }
   else {
    first=uar+D2U(digits+shift)-1; /* where msu of source will end up  */
    for (; source>=uar; source--, target--) {
      /* split the source Unit and accumulate remainder for next  */
      #if DECDPUN<=4
        uInt quot=QUOT10(*source, cut);
        uInt rem=*source-quot*powers[cut];
        next+=quot;
      #else
        uInt rem=*source%powers[cut];
        next+=*source/powers[cut];
      #endif
      if (target<=first) *target=(Unit)next;   /* write to target iff valid  */
      next=rem*powers[DECDPUN-cut];            /* save remainder for next Unit  */
      }
    } /* shift-move  */

  /* propagate any partial unit to one below and clear the rest  */
  for (; target>=uar; target--) {
    *target=(Unit)next;
    next=0;
    }
  return digits+shift;
  }